

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

Result<wasm::Type> *
wasm::WATParser::reftype<wasm::WATParser::ParseModuleTypesCtx>
          (Result<wasm::Type> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  undefined8 *puVar1;
  _Uninitialized<wasm::Type,_true> _Var2;
  undefined1 local_b8 [8];
  MaybeResult<wasm::Type> _val;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  undefined8 uStack_58;
  undefined1 local_50 [8];
  MaybeResult<wasm::Type> t;
  
  maybeReftype<wasm::WATParser::ParseModuleTypesCtx>((MaybeResult<wasm::Type> *)local_50,ctx);
  if (t.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err> *)local_50);
  }
  else {
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::None,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Type,_wasm::None,_wasm::Err> *)local_b8,
                    (_Copy_ctor_base<false,_wasm::Type,_wasm::None,_wasm::Err> *)local_50);
    if (_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02') {
      local_70 = &local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_b8,
                 (long)_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._M_first
                       ._M_storage.id + (long)local_b8);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err> = puVar1;
      if (local_70 == &local_60) {
        *puVar1 = CONCAT71(uStack_5f,local_60);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                 super__Move_assign_alias<wasm::Type,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x18) = uStack_58;
      }
      else {
        *(undefined1 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err> = local_70;
        *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                          super__Move_assign_alias<wasm::Type,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x10) =
             CONCAT71(uStack_5f,local_60);
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::Err> + 8) = local_68;
      local_68 = 0;
      local_60 = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x20) = '\x01';
      local_70 = &local_60;
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err> *)local_b8);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err> *)local_b8);
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err> = local_50;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x20) = '\0';
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err> *)local_50);
    if (t.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._24_1_ != '\x01') {
      return __return_storage_ptr__;
    }
  }
  _val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
  super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
  super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
  super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
  super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._32_8_ = &local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20),
             "expected reftype","");
  Lexer::err((Err *)local_50,&ctx->in,
             (string *)
             ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20));
  puVar1 = (undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                   super__Move_assign_alias<wasm::Type,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x10);
  *(undefined8 **)
   &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
    super__Move_assign_alias<wasm::Type,_wasm::Err>.super__Copy_assign_alias<wasm::Type,_wasm::Err>.
    super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
    super__Variant_storage_alias<wasm::Type,_wasm::Err> = puVar1;
  _Var2._M_storage.id =
       (Type)((long)&t.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 8);
  if ((Type)local_50 == _Var2._M_storage.id) {
    *puVar1 = CONCAT71(t.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._9_7_,
                       t.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._8_1_);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
             super__Move_assign_alias<wasm::Type,_wasm::Err>.
             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
             super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x18) =
         t.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
         super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
         super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
         super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
         super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
         super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._16_8_;
  }
  else {
    *(undefined1 (*) [8])
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::Err>.super__Move_ctor_alias<wasm::Type,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::Err> = local_50;
    *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
                      super__Move_assign_alias<wasm::Type,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x10) =
         CONCAT71(t.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                  super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._9_7_,
                  t.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                  super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._8_1_);
  }
  ((_Uninitialized<wasm::Type,_true> *)
  ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err> + 8))->_M_storage =
       (Type)t.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._M_first.
             _M_storage.id;
  t.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
  super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
  super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
  super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
  super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._M_first._M_storage.id =
       (_Uninitialized<wasm::Type,_true>)(Type)0x0;
  t.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
  super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
  super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
  super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
  super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._8_1_ = 0;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
           super__Move_assign_alias<wasm::Type,_wasm::Err>.
           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
           super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x20) = '\x01';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
         super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
         super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
         super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
         super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
         super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._32_8_ != &local_80) {
    local_50 = (undefined1  [8])_Var2;
    operator_delete((void *)_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._32_8_,
                    local_80._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::TypeT> reftype(Ctx& ctx) {
  if (auto t = maybeReftype(ctx)) {
    CHECK_ERR(t);
    return *t;
  }
  return ctx.in.err("expected reftype");
}